

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O3

SchemeObject * RemainderProcedure(SchemeObject *arguments)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  SchemeObject *pSVar4;
  SchemeObject **ppSVar5;
  
  pSVar2 = Car(arguments);
  cVar1 = IsFixnum(pSVar2);
  if (cVar1 != '\0') {
    pSVar2 = Car(arguments);
    pSVar2 = (pSVar2->data).pair.car;
    pSVar3 = Cdr(arguments);
    pSVar3 = Car(pSVar3);
    pSVar2 = MakeFixnum((long)pSVar2 % (long)(pSVar3->data).pair.car);
    return pSVar2;
  }
  RemainderProcedure_cold_1();
  pSVar3 = Car(pSVar2);
  pSVar3 = (pSVar3->data).pair.car;
  ppSVar5 = &True;
  do {
    pSVar2 = Cdr(pSVar2);
    cVar1 = IsTheEmptyList(pSVar2);
    if (cVar1 != '\0') goto LAB_0010327e;
    pSVar4 = Car(pSVar2);
  } while (pSVar3 == (pSVar4->data).pair.car);
  ppSVar5 = &False;
LAB_0010327e:
  return *ppSVar5;
}

Assistant:

static SchemeObject*
RemainderProcedure(SchemeObject* arguments) /* (remainder ...) */
{
    if (IsFixnum(Car(arguments))) {
        return MakeFixnum((Car(arguments))->data.fixnum.value %
                          (CADR(arguments))->data.fixnum.value);
    } else {
        fprintf(stderr, "invalid operation on floating numbers.\n");
        exit(1);
    }
}